

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O0

UINT8 ymf278b_r(void *info,UINT8 offset)

{
  UINT8 local_21;
  UINT8 ret;
  YMF278BChip *chip;
  UINT8 offset_local;
  void *info_local;
  
  local_21 = '\0';
  switch(offset) {
  case '\0':
    local_21 = ymf278b_readStatus((YMF278BChip *)info);
    break;
  case '\x01':
  case '\x03':
    local_21 = *(UINT8 *)((long)info + 0x648);
    break;
  default:
    emu_logf((DEV_LOGGER *)((long)info + 8),'\x04',"unexpected read at offset %X from ymf278b\n",
             (ulong)offset);
    break;
  case '\x05':
    if (((*(byte *)((long)info + 0x644) ^ 0xff) & 2) == 0) {
      local_21 = ymf278b_readReg((YMF278BChip *)info,*(UINT8 *)((long)info + 0x646));
    }
  }
  return local_21;
}

Assistant:

static UINT8 ymf278b_r(void *info, UINT8 offset)
{
	YMF278BChip *chip = (YMF278BChip *)info;
	UINT8 ret = 0;

	switch (offset)
	{
		// status register
		case 0:
		{
			// bits 0 and 1 are only valid if NEW2 is set
			//UINT8 newbits = 0;
			//if (chip->exp & 2)
			//	newbits = (chip->status_ld << 1) | chip->status_busy;

			//ret = newbits | chip->current_irq | (chip->irq_line == ASSERT_LINE ? 0x80 : 0x00);
			ret = ymf278b_readStatus(chip);
			break;
		}

		// FM regs can be read too (on contrary to what the datasheet says)
		case 1:
		case 3:
			// but they're not implemented here yet
			// This may be incorrect, but it makes the mbwave moonsound detection in msx drivers pass.
			ret = chip->last_fm_data;
			break;

		// PCM regs
		case 5:
			// only accessible if NEW2 is set
			if (~chip->exp & 2)
				break;

			ret = ymf278b_readReg(chip, chip->port_C);
			break;

		default:
			emu_logf(&chip->logger, DEVLOG_DEBUG, "unexpected read at offset %X from ymf278b\n", offset);
			break;
	}

	return ret;
}